

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O2

uint32_t x86_lduw_phys_x86_64(CPUState *cs,hwaddr addr)

{
  uint32_t uVar1;
  AddressSpace *as;
  MemTxAttrs attrs;
  
  attrs = (MemTxAttrs)(*(uint *)(cs[1].tb_jmp_cache + 0x101) >> 0x12 & 2);
  as = cpu_addressspace(cs,attrs);
  uVar1 = address_space_lduw_x86_64((uc_struct_conflict *)as->uc,as,addr,attrs,(MemTxResult *)0x0);
  return uVar1;
}

Assistant:

uint32_t x86_lduw_phys(CPUState *cs, hwaddr addr)
{
    X86CPU *cpu = X86_CPU(cs);
    CPUX86State *env = &cpu->env;
    MemTxAttrs attrs = cpu_get_mem_attrs(env);
    AddressSpace *as = cpu_addressspace(cs, attrs);

#ifdef UNICORN_ARCH_POSTFIX
    return glue(address_space_lduw, UNICORN_ARCH_POSTFIX)(as->uc, as, addr, attrs, NULL);
#else
    return address_space_lduw(as->uc, as, addr, attrs, NULL);
#endif
}